

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_types.cpp
# Opt level: O2

void __thiscall
jaegertracing::sampling_manager::thrift::PerOperationSamplingStrategies::printTo
          (PerOperationSamplingStrategies *this,ostream *out)

{
  ostream *poVar1;
  double *t;
  double *t_00;
  double *t_01;
  string local_40;
  
  std::operator<<(out,"PerOperationSamplingStrategies(");
  poVar1 = std::operator<<(out,"defaultSamplingProbability=");
  apache::thrift::to_string_abi_cxx11_(&local_40,(thrift *)&this->defaultSamplingProbability,t);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"defaultLowerBoundTracesPerSecond=");
  apache::thrift::to_string_abi_cxx11_
            (&local_40,(thrift *)&this->defaultLowerBoundTracesPerSecond,t_00);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"perOperationStrategies=");
  apache::thrift::to_string<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>
            (&local_40,&this->perOperationStrategies);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"defaultUpperBoundTracesPerSecond=");
  if (((byte)this->__isset & 1) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    apache::thrift::to_string_abi_cxx11_
              (&local_40,(thrift *)&this->defaultUpperBoundTracesPerSecond,t_01);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::operator<<(out,")");
  return;
}

Assistant:

void PerOperationSamplingStrategies::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "PerOperationSamplingStrategies(";
  out << "defaultSamplingProbability=" << to_string(defaultSamplingProbability);
  out << ", " << "defaultLowerBoundTracesPerSecond=" << to_string(defaultLowerBoundTracesPerSecond);
  out << ", " << "perOperationStrategies=" << to_string(perOperationStrategies);
  out << ", " << "defaultUpperBoundTracesPerSecond="; (__isset.defaultUpperBoundTracesPerSecond ? (out << to_string(defaultUpperBoundTracesPerSecond)) : (out << "<null>"));
  out << ")";
}